

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::listReporters
          (XmlReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions,IConfig *param_2)

{
  XmlWriter *this_00;
  pointer text;
  allocator<char> local_79;
  pointer local_78;
  ScopedElement inner;
  string local_60;
  ScopedElement outerTag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"AvailableReporters",(allocator<char> *)&inner);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&outerTag,(string *)this_00,(XmlFormatting)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = (descriptions->
             super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  for (text = (descriptions->
              super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
              )._M_impl.super__Vector_impl_data._M_start; text != local_78; text = text + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Reporter",&local_79);
    XmlWriter::scopedElement((XmlWriter *)&inner,(string *)this_00,(XmlFormatting)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Name",&local_79);
    XmlWriter::startElement(this_00,&local_60,Indent);
    XmlWriter::writeText(this_00,&text->name,None);
    XmlWriter::endElement(this_00,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Description",&local_79);
    XmlWriter::startElement(this_00,&local_60,Indent);
    XmlWriter::writeText(this_00,&text->description,None);
    XmlWriter::endElement(this_00,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    XmlWriter::ScopedElement::~ScopedElement(&inner);
  }
  XmlWriter::ScopedElement::~ScopedElement(&outerTag);
  return;
}

Assistant:

void XmlReporter::listReporters(std::vector<ReporterDescription> const &descriptions, IConfig const &) {
        auto outerTag = m_xml.scopedElement("AvailableReporters");
        for (auto const &reporter : descriptions) {
            auto inner = m_xml.scopedElement("Reporter");
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(reporter.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Description", XmlFormatting::Indent)
                .writeText(reporter.description, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }